

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void substrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  sqlite3_value *pVal;
  sqlite3_value *psVar4;
  sqlite3 *psVar5;
  byte *pbVar6;
  undefined8 *in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  i64 p2;
  i64 p1;
  int p0type;
  int len;
  uchar *z2;
  uchar *z;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  sqlite3_value *n;
  byte *local_28;
  byte *local_20;
  
  iVar2 = sqlite3_value_type((sqlite3_value *)in_RDX[1]);
  if ((iVar2 != 5) &&
     ((in_ESI != 3 || (iVar2 = sqlite3_value_type((sqlite3_value *)in_RDX[2]), iVar2 != 5)))) {
    iVar2 = sqlite3_value_type((sqlite3_value *)*in_RDX);
    pVal = (sqlite3_value *)sqlite3_value_int64((sqlite3_value *)0x2252c3);
    if (iVar2 == 4) {
      iVar3 = sqlite3_value_bytes((sqlite3_value *)0x2252dc);
      local_20 = (byte *)sqlite3_value_blob(pVal);
      if (local_20 == (byte *)0x0) {
        return;
      }
    }
    else {
      local_20 = sqlite3_value_text((sqlite3_value *)0x225311);
      if (local_20 == (byte *)0x0) {
        return;
      }
      iVar3 = 0;
      local_28 = local_20;
      if ((long)pVal < 0) {
        while (*local_28 != 0) {
          pbVar6 = local_28 + 1;
          bVar1 = *local_28;
          local_28 = pbVar6;
          if (0xbf < bVar1) {
            for (; (*local_28 & 0xc0) == 0x80; local_28 = local_28 + 1) {
            }
          }
          iVar3 = iVar3 + 1;
        }
      }
    }
    if (in_ESI == 3) {
      psVar4 = (sqlite3_value *)sqlite3_value_int64((sqlite3_value *)0x2253b2);
    }
    else {
      psVar5 = sqlite3_context_db_handle(in_RDI);
      psVar4 = (sqlite3_value *)(long)psVar5->aLimit[0];
    }
    if ((long)pVal < 0) {
      pVal = (sqlite3_value *)((long)&pVal->u + (long)iVar3);
      if ((long)pVal < 0) {
        if ((long)psVar4 < 0) {
          psVar4 = (sqlite3_value *)0x0;
        }
        else {
          psVar4 = (sqlite3_value *)((long)&psVar4->u + (long)&pVal->u);
        }
        pVal = (sqlite3_value *)0x0;
      }
    }
    else if ((long)pVal < 1) {
      if (0 < (long)psVar4) {
        psVar4 = (sqlite3_value *)((long)&psVar4[-1].xDel + 7);
      }
    }
    else {
      pVal = (sqlite3_value *)((long)&pVal[-1].xDel + 7);
    }
    n = psVar4;
    if ((long)psVar4 < 0) {
      n = pVal;
      if (-(long)pVal <= (long)psVar4) {
        n = (sqlite3_value *)-(long)psVar4;
      }
      pVal = (sqlite3_value *)((long)pVal - (long)n);
    }
    if (iVar2 == 4) {
      if ((long)pVal < (long)iVar3) {
        if ((long)iVar3 - (long)pVal < (long)n) {
          n = (sqlite3_value *)((long)iVar3 - (long)pVal);
        }
      }
      else {
        n = (sqlite3_value *)0x0;
        pVal = (sqlite3_value *)0x0;
      }
      sqlite3_result_blob64
                ((sqlite3_context *)CONCAT44(iVar3,4),pVal,(sqlite3_uint64)n,
                 (_func_void_void_ptr *)
                 CONCAT17(in_stack_ffffffffffffffbf,
                          CONCAT16(in_stack_ffffffffffffffbe,in_stack_ffffffffffffffb8)));
    }
    else {
      for (; *local_20 != 0 && pVal != (sqlite3_value *)0x0;
          pVal = (sqlite3_value *)((long)&pVal[-1].xDel + 7)) {
        pbVar6 = local_20 + 1;
        bVar1 = *local_20;
        local_20 = pbVar6;
        if (0xbf < bVar1) {
          for (; (*local_20 & 0xc0) == 0x80; local_20 = local_20 + 1) {
          }
        }
      }
      local_28 = local_20;
      for (; *local_28 != 0 && n != (sqlite3_value *)0x0;
          n = (sqlite3_value *)((long)&n[-1].xDel + 7)) {
        pbVar6 = local_28 + 1;
        bVar1 = *local_28;
        local_28 = pbVar6;
        if (0xbf < bVar1) {
          for (; (*local_28 & 0xc0) == 0x80; local_28 = local_28 + 1) {
          }
        }
      }
      sqlite3_result_text64
                ((sqlite3_context *)CONCAT44(iVar3,iVar2),(char *)pVal,(sqlite3_uint64)n,
                 (_func_void_void_ptr *)
                 CONCAT17(*local_20 != 0 && pVal != (sqlite3_value *)0x0,
                          CONCAT16(*local_28 != 0 && n != (sqlite3_value *)0x0,
                                   in_stack_ffffffffffffffb8)),'\0');
    }
  }
  return;
}

Assistant:

static void substrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z;
  const unsigned char *z2;
  int len;
  int p0type;
  i64 p1, p2;

  assert( argc==3 || argc==2 );
  if( sqlite3_value_type(argv[1])==SQLITE_NULL
   || (argc==3 && sqlite3_value_type(argv[2])==SQLITE_NULL)
  ){
    return;
  }
  p0type = sqlite3_value_type(argv[0]);
  p1 = sqlite3_value_int64(argv[1]);
  if( p0type==SQLITE_BLOB ){
    len = sqlite3_value_bytes(argv[0]);
    z = sqlite3_value_blob(argv[0]);
    if( z==0 ) return;
    assert( len==sqlite3_value_bytes(argv[0]) );
  }else{
    z = sqlite3_value_text(argv[0]);
    if( z==0 ) return;
    len = 0;
    if( p1<0 ){
      for(z2=z; *z2; len++){
        SQLITE_SKIP_UTF8(z2);
      }
    }
  }
#ifdef SQLITE_SUBSTR_COMPATIBILITY
  /* If SUBSTR_COMPATIBILITY is defined then substr(X,0,N) work the same as
  ** as substr(X,1,N) - it returns the first N characters of X.  This
  ** is essentially a back-out of the bug-fix in check-in [5fc125d362df4b8]
  ** from 2009-02-02 for compatibility of applications that exploited the
  ** old buggy behavior. */
  if( p1==0 ) p1 = 1; /* <rdar://problem/6778339> */
#endif
  if( argc==3 ){
    p2 = sqlite3_value_int64(argv[2]);
  }else{
    p2 = sqlite3_context_db_handle(context)->aLimit[SQLITE_LIMIT_LENGTH];
  }
  if( p1<0 ){
    p1 += len;
    if( p1<0 ){
      if( p2<0 ){
        p2 = 0;
      }else{
        p2 += p1;
      }
      p1 = 0;
    }
  }else if( p1>0 ){
    p1--;
  }else if( p2>0 ){
    p2--;
  }
  if( p2<0 ){
    if( p2<-p1 ){
      p2 = p1;
    }else{
      p2 = -p2;
    }
    p1 -= p2;
  }
  assert( p1>=0 && p2>=0 );
  if( p0type!=SQLITE_BLOB ){
    while( *z && p1 ){
      SQLITE_SKIP_UTF8(z);
      p1--;
    }
    for(z2=z; *z2 && p2; p2--){
      SQLITE_SKIP_UTF8(z2);
    }
    sqlite3_result_text64(context, (char*)z, z2-z, SQLITE_TRANSIENT,
                          SQLITE_UTF8);
  }else{
    if( p1>=len ){
      p1 = p2 = 0;
    }else if( p2>len-p1 ){
      p2 = len-p1;
      assert( p2>0 );
    }
    sqlite3_result_blob64(context, (char*)&z[p1], (u64)p2, SQLITE_TRANSIENT);
  }
}